

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

TypeInfo * dap::TypeOf<std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>_>::type(void)

{
  int iVar1;
  TypeInfo *pTVar2;
  long *plVar3;
  BasicTypeInfo<std::vector<dap::Breakpoint,_std::allocator<dap::Breakpoint>_>_> *pBVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (TypeOf<std::vector<dap::Breakpoint,std::allocator<dap::Breakpoint>>>::type()::typeinfo == '\0'
     ) {
    iVar1 = __cxa_guard_acquire(&TypeOf<std::vector<dap::Breakpoint,std::allocator<dap::Breakpoint>>>
                                 ::type()::typeinfo);
    if (iVar1 != 0) {
      pTVar2 = TypeOf<dap::Breakpoint>::type();
      (*pTVar2->_vptr_TypeInfo[2])(&local_50,pTVar2);
      std::operator+(&local_30,"array<",&local_50);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_30);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70.field_2._8_8_ = plVar3[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar5;
        local_70._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_70._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      pBVar4 = TypeInfo::
               create<dap::BasicTypeInfo<std::vector<dap::Breakpoint,std::allocator<dap::Breakpoint>>>,std::__cxx11::string>
                         (&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      type::typeinfo = pBVar4;
      __cxa_guard_release(&TypeOf<std::vector<dap::Breakpoint,std::allocator<dap::Breakpoint>>>::
                           type()::typeinfo);
    }
  }
  return &type::typeinfo->super_TypeInfo;
}

Assistant:

static inline const TypeInfo* type() {
    static auto typeinfo = TypeInfo::create<BasicTypeInfo<array<T>>>(
        "array<" + TypeOf<T>::type()->name() + ">");
    return typeinfo;
  }